

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BOM BVar6;
  uint uVar7;
  string *__s;
  undefined8 uVar8;
  char *pcVar9;
  ostream *poVar10;
  ulong uVar11;
  uint *puVar12;
  char *pcVar13;
  undefined1 uVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  char cVar18;
  pointer pbVar19;
  uint uVar20;
  BOM BVar21;
  int iVar22;
  string *psVar23;
  int limit_output;
  string fileName;
  string output;
  int limit_input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string outVar;
  string s;
  ifstream fin;
  RegularExpression regex;
  uint local_550;
  int local_54c;
  ulong local_548;
  uint local_53c;
  long *local_538;
  char *local_530;
  long local_528 [2];
  string local_518;
  uint local_4f8;
  int local_4f4;
  ulong local_4f0;
  char *local_4e8;
  ulong local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  uint local_4b8;
  uint local_4b4;
  ulong local_4b0;
  string local_4a8;
  char *local_488;
  undefined1 local_480 [8];
  char *local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [6];
  ios_base local_410 [264];
  undefined1 local_308 [32];
  uint auStack_2e8 [20];
  ios_base local_298 [408];
  RegularExpression local_100;
  string *psVar24;
  
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x41) {
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    return (bool)0;
  }
  local_538 = local_528;
  pcVar1 = pbVar19[1]._M_dataplus._M_p;
  __s = (string *)&local_538;
  std::__cxx11::string::_M_construct<char*>(__s,pcVar1,pcVar1 + pbVar19[1]._M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath((char *)local_538);
  if (!bVar3) {
    __s = (string *)cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    pcVar9 = local_530;
    strlen((char *)__s);
    std::__cxx11::string::_M_replace((ulong)&local_538,0,pcVar9,(ulong)__s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   "/",(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::_M_append((char *)&local_538,local_308._0_8_);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
  }
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  pcVar1 = pbVar19[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,pcVar1,pcVar1 + pbVar19[2]._M_string_length);
  local_4f4 = -1;
  local_54c = -1;
  local_100.program = (char *)0x0;
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0x60 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19)) {
    bVar3 = true;
    uVar20 = 3;
    uVar16 = 3;
    local_548 = 0;
    local_4e0 = 0;
    local_4f0 = 0;
    local_53c = 0;
    local_4f8 = 0;
    local_550 = 0;
    psVar23 = (string *)0x0;
LAB_002f7b92:
    do {
      __s = psVar23;
      uVar20 = uVar20 + 1;
      iVar5 = std::__cxx11::string::compare((char *)(pbVar19 + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x1;
        goto LAB_002f7d36;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x2;
        goto LAB_002f7d36;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x3;
        goto LAB_002f7d36;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x4;
        goto LAB_002f7d36;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x5;
        goto LAB_002f7d36;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x7;
        goto LAB_002f7d36;
      }
      uVar8 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      psVar24 = (string *)0x0;
      psVar23 = (string *)0x0;
      if ((int)uVar8 == 0) {
        local_4e0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
        psVar23 = psVar24;
        goto LAB_002f7d36;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) goto code_r0x002f7c5e;
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar16));
      if (iVar5 == 0) {
        psVar23 = (string *)0x8;
        goto LAB_002f7d36;
      }
      __s = (string *)(ulong)((int)__s - 1);
      puVar12 = &switchD_002f7cfc::switchdataD_004b7f6c;
      switch(__s) {
      case (string *)0x0:
        iVar5 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_4f4);
        if ((iVar5 != 1) || (psVar23 = (string *)0x0, local_4f4 < 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LIMIT_INPUT value \"",0x22);
          pbVar19 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                               pbVar19[uVar16]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
          goto LAB_002f8bd9;
        }
        break;
      case (string *)0x1:
        iVar5 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_54c);
        if ((iVar5 != 1) || (psVar23 = (string *)0x0, local_54c < 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option LIMIT_OUTPUT value \"",0x23);
          pbVar19 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                               pbVar19[uVar16]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\" is not an unsigned integer.",0x1d);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
          goto LAB_002f8bd9;
        }
        break;
      case (string *)0x2:
        iVar5 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_518);
        if (iVar5 == 1) {
          local_53c = (uint)local_518._M_dataplus._M_p;
          if (-1 < (int)(uint)local_518._M_dataplus._M_p) break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LIMIT_COUNT value \"",0x22);
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                             pbVar19[uVar16]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
        goto LAB_002f8bd9;
      case (string *)0x3:
        iVar5 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_518);
        if (iVar5 == 1) {
          local_550 = (uint)local_518._M_dataplus._M_p;
          if (-1 < (int)(uint)local_518._M_dataplus._M_p) break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LENGTH_MINIMUM value \"",0x25);
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                             pbVar19[uVar16]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
        goto LAB_002f8bd9;
      case (string *)0x4:
        iVar5 = __isoc99_sscanf((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p,
                                "%d",&local_518);
        if (iVar5 == 1) {
          local_4f8 = (uint)local_518._M_dataplus._M_p;
          if (-1 < (int)(uint)local_518._M_dataplus._M_p) break;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS option LENGTH_MAXIMUM value \"",0x25);
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                             pbVar19[uVar16]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\" is not an unsigned integer.",0x1d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
        goto LAB_002f8bd9;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_308,"STRINGS given unknown argument \"",0x20);
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                             pbVar19[uVar16]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
LAB_002f8bd9:
        if (local_480 != (undefined1  [8])local_470) {
          operator_delete((void *)local_480,
                          CONCAT71(local_470[0]._M_allocated_capacity._1_7_,
                                   local_470[0]._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
        std::ios_base::~ios_base(local_298);
        uVar14 = 0;
        goto LAB_002f87ac;
      case (string *)0x6:
        bVar4 = cmsys::RegularExpression::compile
                          (&local_100,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p);
        local_4f0 = CONCAT71((int7)((ulong)puVar12 >> 8),1);
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_308,"STRINGS option REGEX value \"",0x1c);
          pbVar19 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                               pbVar19[uVar16]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\" could not be compiled.",0x18);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
          goto LAB_002f8bd9;
        }
        break;
      case (string *)0x7:
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar16));
        if (iVar5 == 0) {
          local_548 = 1;
          psVar23 = psVar24;
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar16));
          if (iVar5 == 0) {
            local_548 = 3;
            psVar23 = psVar24;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar16));
            if (iVar5 == 0) {
              local_548 = 2;
              psVar23 = psVar24;
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar16));
              if (iVar5 == 0) {
                local_548 = 5;
                psVar23 = psVar24;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar16));
                local_548 = 4;
                psVar23 = psVar24;
                if (iVar5 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_308,"STRINGS option ENCODING \"",0x19);
                  pbVar19 = (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_308,pbVar19[uVar16]._M_dataplus._M_p,
                                       pbVar19[uVar16]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"\" not recognized.",0x11);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
                  if (local_480 != (undefined1  [8])local_470) {
                    operator_delete((void *)local_480,
                                    CONCAT71(local_470[0]._M_allocated_capacity._1_7_,
                                             local_470[0]._M_local_buf[0]) + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
                  std::ios_base::~ios_base(local_298);
                  uVar14 = 0;
                  goto LAB_002f87ac;
                }
              }
            }
          }
        }
      }
LAB_002f7d36:
      uVar16 = (ulong)uVar20;
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19 >> 5) <= uVar16)
      {
        local_4e8 = (char *)(ulong)local_550;
        BVar21 = (BOM)local_548;
        if (bVar3) goto LAB_002f7f37;
        goto LAB_002f7fe3;
      }
    } while( true );
  }
  BVar21 = BOM_None;
  local_4e0 = 0;
  local_4f0 = 0;
  local_53c = 0;
  local_4f8 = 0;
  local_4e8 = (char *)0x0;
LAB_002f7f37:
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)local_308,pcVar9,(allocator *)local_480);
  std::__cxx11::string::append(local_308);
  std::__cxx11::string::append(local_308);
  bVar3 = cmHexFileConverter::TryConvert((char *)local_538,(char *)local_308._0_8_);
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&local_538);
  }
  if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
LAB_002f7fe3:
  std::ifstream::ifstream(local_308,(char *)local_538,_S_in);
  bVar3 = (*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) == 0;
  uVar16 = CONCAT71((int7)((ulong)__s >> 8),bVar3);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_480,"STRINGS file \"",0xe);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_480,(char *)local_538,(long)local_530);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" cannot be read.",0x11);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                               local_518.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
    std::ios_base::~ios_base(local_410);
    goto LAB_002f879f;
  }
  local_4b8 = (uint)uVar16;
  BVar6 = cmsys::FStream::ReadBOM((istream *)local_308);
  if (BVar6 == BOM_None) {
    BVar6 = BVar21;
  }
  if (BVar21 != BOM_None) {
    BVar6 = BVar21;
  }
  local_4b4 = 3;
  if ((BVar6 & ~BOM_UTF8) != BOM_UTF32BE) {
    local_4b4 = (uint)((BVar6 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480 = (undefined1  [8])local_470;
  local_478 = (char *)0x0;
  local_470[0]._M_local_buf[0] = '\0';
  local_4b0 = (ulong)local_53c;
  local_488 = (char *)(ulong)local_4f8;
  uVar16 = 0;
  do {
    if ((local_53c != 0) &&
       (uVar11 = (long)local_4d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, local_4b0 <= uVar11))
    goto LAB_002f8625;
    if (((-1 < local_4f4) && (iVar5 = std::istream::tellg(), local_4f4 <= iVar5)) ||
       ((*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0)) break;
    local_518._M_string_length = 0;
    local_518.field_2._M_local_buf[0] = '\0';
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    uVar20 = std::istream::get();
    cVar18 = (char)local_308;
    local_548 = uVar16;
    for (uVar15 = local_4b4; uVar15 != 0; uVar15 = uVar15 - 1) {
      uVar7 = std::istream::get();
      if ((*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0) {
        std::istream::putback(cVar18);
        break;
      }
      uVar20 = uVar20 << 8 | uVar7;
    }
    uVar16 = local_548;
    if (BVar6 == BOM_UTF32LE) {
      uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
    }
    else if (BVar6 == BOM_UTF16LE) {
      uVar20 = (uint)(ushort)((ushort)uVar20 << 8 | (ushort)uVar20 >> 8);
    }
    if (uVar20 == 0xd) {
      bVar3 = false;
    }
    else {
      if (((uVar20 == 9) || (uVar20 - 0x20 < 0x5f)) || ((uVar20 == 10 & (byte)local_4e0) != 0)) {
        std::__cxx11::string::push_back((char)&local_518);
      }
      else if (BVar6 == BOM_UTF8) {
        uVar16 = 0;
        iVar5 = 2;
        do {
          iVar22 = iVar5;
          uVar15 = HandleStringsCommand::utf8_check_table[uVar16][0] & uVar20;
          uVar11 = uVar16 + 1;
          uVar7 = (uint)HandleStringsCommand::utf8_check_table[uVar16][1];
          if (uVar15 == uVar7) break;
          bVar3 = uVar16 < 2;
          uVar16 = uVar11;
          iVar5 = iVar22 + 1;
        } while (bVar3);
        uVar2 = (int)uVar11 + 1;
        if (uVar15 != uVar7) {
          uVar2 = 0;
        }
        if (uVar15 == uVar7) {
          iVar5 = 0;
          do {
            bVar3 = iVar5 != 0;
            iVar5 = iVar5 + -1;
            if ((bVar3) &&
               ((uVar20 = std::istream::get(), (uVar20 & 0xc0) != 0x80 ||
                ((*(uint *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0)))) {
              std::istream::putback(cVar18);
              break;
            }
            std::__cxx11::string::push_back((char)&local_518);
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
        }
        uVar16 = local_548;
        if ((char *)local_518._M_string_length != (char *)(ulong)uVar2) {
          pcVar9 = (char *)0x1;
          if ((char *)local_518._M_string_length != (char *)0x1) {
            pcVar13 = (char *)0x0;
            pcVar17 = (char *)0x1;
            do {
              uVar20 = (uint)((char *)(local_518._M_string_length + (long)local_518._M_dataplus._M_p
                                      ))[~(ulong)pcVar13];
              std::istream::putback(cVar18);
              bVar3 = pcVar17 < (char *)(local_518._M_string_length + -1);
              pcVar13 = pcVar17;
              pcVar9 = (char *)local_518._M_string_length;
              pcVar17 = (char *)(ulong)((int)pcVar17 + 1);
            } while (bVar3);
          }
          std::__cxx11::string::_M_replace((ulong)&local_518,0,pcVar9,0x4f3811);
          uVar16 = local_548;
        }
      }
      if (uVar20 == 10 && (local_4e0 & 1) == 0) {
        if ((local_4e8 <= local_478) &&
           (((local_4f0 & 1) == 0 ||
            (bVar3 = cmsys::RegularExpression::find(&local_100,(char *)local_480), bVar3)))) {
          uVar20 = (int)uVar16 + (int)local_478 + 1;
          uVar16 = (ulong)uVar20;
          if ((-1 < local_54c) && (local_54c <= (int)uVar20)) {
            bVar3 = true;
            std::__cxx11::string::_M_replace((ulong)local_480,0,local_478,0x4f3811);
            goto LAB_002f85eb;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4d8,(value_type *)local_480);
        }
        std::__cxx11::string::_M_replace((ulong)local_480,0,local_478,0x4f3811);
      }
      else if ((char *)local_518._M_string_length == (char *)0x0) {
        if ((local_478 != (char *)0x0 && local_4e8 <= local_478) &&
           (((local_4f0 & 1) == 0 ||
            (bVar3 = cmsys::RegularExpression::find(&local_100,(char *)local_480), bVar3)))) {
          uVar20 = (int)uVar16 + (int)local_478 + 1;
          uVar16 = (ulong)uVar20;
          if ((-1 < local_54c) && (local_54c <= (int)uVar20)) {
            bVar3 = true;
            std::__cxx11::string::_M_replace((ulong)local_480,0,local_478,0x4f3811);
            goto LAB_002f85eb;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4d8,(value_type *)local_480);
        }
        std::__cxx11::string::_M_replace((ulong)local_480,0,local_478,0x4f3811);
      }
      else {
        std::__cxx11::string::_M_append(local_480,(ulong)local_518._M_dataplus._M_p);
      }
      bVar3 = false;
      if ((local_4f8 != 0) && (local_478 == local_488)) {
        pcVar9 = local_488;
        if (((uint)local_4e8 <= (uint)local_488) &&
           (((local_4f0 & 1) == 0 ||
            (bVar3 = cmsys::RegularExpression::find(&local_100,(char *)local_480),
            pcVar9 = local_478, bVar3)))) {
          uVar20 = (int)uVar16 + (int)pcVar9 + 1;
          uVar16 = (ulong)uVar20;
          if ((-1 < local_54c) && (local_54c <= (int)uVar20)) {
            bVar3 = true;
            std::__cxx11::string::_M_replace((ulong)local_480,0,pcVar9,0x4f3811);
            goto LAB_002f85eb;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4d8,(value_type *)local_480);
          pcVar9 = local_478;
        }
        bVar3 = false;
        std::__cxx11::string::_M_replace((ulong)local_480,0,pcVar9,0x4f3811);
      }
    }
LAB_002f85eb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                               local_518.field_2._M_local_buf[0]) + 1);
    }
  } while (!bVar3);
  iVar5 = (int)uVar16;
  if (local_53c == 0) {
LAB_002f863b:
    if ((((local_478 != (char *)0x0) && (local_4e8 <= local_478)) &&
        (((local_4f0 & 1) == 0 ||
         (bVar3 = cmsys::RegularExpression::find(&local_100,(char *)local_480), bVar3)))) &&
       ((local_54c < 0 || ((int)local_478 + iVar5 + 1 < local_54c)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4d8,(value_type *)local_480);
    }
  }
  else {
    uVar11 = (long)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_002f8625:
    iVar5 = (int)uVar16;
    if (uVar11 < local_4b0) goto LAB_002f863b;
  }
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  local_518._M_string_length = 0;
  local_518.field_2._M_local_buf[0] = '\0';
  if (local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar19 = local_4d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::append((char *)&local_518);
      if (pbVar19->_M_string_length != 0) {
        uVar20 = 1;
        uVar16 = 0;
        do {
          cVar18 = (char)&local_518;
          if ((pbVar19->_M_dataplus)._M_p[uVar16] == ';') {
            std::__cxx11::string::push_back(cVar18);
          }
          std::__cxx11::string::push_back(cVar18);
          uVar16 = (ulong)uVar20;
          uVar20 = uVar20 + 1;
        } while (uVar16 < pbVar19->_M_string_length);
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 !=
             local_4d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_4a8,local_518._M_dataplus._M_p);
  uVar16 = (ulong)local_4b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,
                    CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                             local_518.field_2._M_local_buf[0]) + 1);
  }
  if (local_480 != (undefined1  [8])local_470) {
    operator_delete((void *)local_480,
                    CONCAT71(local_470[0]._M_allocated_capacity._1_7_,local_470[0]._M_local_buf[0])
                    + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
LAB_002f879f:
  uVar14 = (undefined1)uVar16;
  std::ifstream::~ifstream(local_308);
LAB_002f87ac:
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_538 != local_528) {
    operator_delete(local_538,local_528[0] + 1);
  }
  return (bool)uVar14;
code_r0x002f7c5e:
  uVar16 = (ulong)uVar20;
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __s = (string *)0x0;
  bVar3 = false;
  psVar23 = __s;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19 >> 5) <= uVar16)
  goto LAB_002f7fcc;
  goto LAB_002f7b92;
LAB_002f7fcc:
  local_4e8 = (char *)(ulong)local_550;
  BVar21 = (BOM)local_548;
  goto LAB_002f7fe3;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if(args.size() < 3)
    {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
    }

  // Get the file to read.
  std::string fileName = args[1];
  if(!cmsys::SystemTools::FileIsFullPath(fileName.c_str()))
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
    }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum { arg_none,
         arg_limit_input,
         arg_limit_output,
         arg_limit_count,
         arg_length_minimum,
         arg_length_maximum,
         arg__maximum,
         arg_regex,
         arg_encoding };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum { encoding_none = cmsys::FStream::BOM_None,
         encoding_utf8 = cmsys::FStream::BOM_UTF8,
         encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
         encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
         encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
         encoding_utf32be = cmsys::FStream::BOM_UTF32BE};
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for(unsigned int i=3; i < args.size(); ++i)
    {
    if(args[i] == "LIMIT_INPUT")
      {
      arg_mode = arg_limit_input;
      }
    else if(args[i] == "LIMIT_OUTPUT")
      {
      arg_mode = arg_limit_output;
      }
    else if(args[i] == "LIMIT_COUNT")
      {
      arg_mode = arg_limit_count;
      }
    else if(args[i] == "LENGTH_MINIMUM")
      {
      arg_mode = arg_length_minimum;
      }
    else if(args[i] == "LENGTH_MAXIMUM")
      {
      arg_mode = arg_length_maximum;
      }
    else if(args[i] == "REGEX")
      {
      arg_mode = arg_regex;
      }
    else if(args[i] == "NEWLINE_CONSUME")
      {
      newline_consume = true;
      arg_mode = arg_none;
      }
    else if(args[i] == "NO_HEX_CONVERSION")
      {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
      }
    else if(args[i] == "ENCODING")
      {
      arg_mode = arg_encoding;
      }
    else if(arg_mode == arg_limit_input)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
         limit_input < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_output)
      {
      if(sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
         limit_output < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_limit_count)
      {
      int count;
      if(sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      limit_count = count;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_minimum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      minlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_length_maximum)
      {
      int len;
      if(sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0)
        {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \""
          << args[i] << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
        }
      maxlen = len;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_regex)
      {
      if(!regex.compile(args[i].c_str()))
        {
        std::ostringstream e;
        e << "STRINGS option REGEX value \""
          << args[i] << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
        }
      have_regex = true;
      arg_mode = arg_none;
      }
    else if(arg_mode == arg_encoding)
      {
      if(args[i] == "UTF-8")
        {
        encoding = encoding_utf8;
        }
      else if(args[i] == "UTF-16LE")
        {
        encoding = encoding_utf16le;
        }
      else if(args[i] == "UTF-16BE")
        {
        encoding = encoding_utf16be;
        }
      else if(args[i] == "UTF-32LE")
        {
        encoding = encoding_utf32le;
        }
      else if(args[i] == "UTF-32BE")
        {
        encoding = encoding_utf32be;
        }
      else
        {
        std::ostringstream e;
        e << "STRINGS option ENCODING \""
          << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
        }
      arg_mode = arg_none;
      }
    else
      {
      std::ostringstream e;
      e << "STRINGS given unknown argument \""
        << args[i] << "\"";
      this->SetError(e.str());
      return false;
      }
    }

  if (hex_conversion_enabled)
    {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += cmake::GetCMakeFilesDirectory();
    binaryFileName += "/FileCommandStringsBinaryFile";
    if(cmHexFileConverter::TryConvert(fileName.c_str(),binaryFileName.c_str()))
      {
      fileName = binaryFileName;
      }
    }

  // Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
    }

  //If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if(encoding == encoding_none && bom_found != cmsys::FStream::BOM_None)
    {
    encoding = bom_found;
    }

  unsigned int bytes_rem = 0;
  if(encoding == encoding_utf16le || encoding == encoding_utf16be)
    {
    bytes_rem = 1;
    }
  if(encoding == encoding_utf32le || encoding == encoding_utf32be)
    {
    bytes_rem = 3;
    }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while((!limit_count || strings.size() < limit_count) &&
        (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
        fin)
    {
    std::string current_str;

    int c = fin.get();
    for(unsigned int i=0; i<bytes_rem; ++i)
      {
      int c1 = fin.get();
      if(!fin)
        {
        fin.putback(static_cast<char>(c1));
        break;
        }
      c = (c << 8) | c1;
      }
    if(encoding == encoding_utf16le)
      {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
      }
    else if(encoding == encoding_utf32le)
      {
       c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) |
          ((c & 0xFF0000) >> 8) | ((c & 0xFF000000) >> 24));
      }

    if(c == '\r')
      {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
      }

    else if((c >= 0x20 && c < 0x7F) || c == '\t' ||
            (c == '\n' && newline_consume))
      {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
      }
    else if(encoding == encoding_utf8)
      {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] =
        {
          {0xE0, 0xC0},
          {0xF0, 0xE0},
          {0xF8, 0xF0},
        };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for(unsigned int j=0; num_utf8_bytes == 0 && j<3; j++)
        {
        if((c & utf8_check_table[j][0]) == utf8_check_table[j][1])
          num_utf8_bytes = j+2;
        }

      // get subsequent octets and check that they are valid
      for(unsigned int j=0; j<num_utf8_bytes; j++)
        {
        if(j != 0)
          {
          c = fin.get();
          if(!fin || (c & 0xC0) != 0x80)
            {
            fin.putback(static_cast<char>(c));
            break;
            }
          }
        current_str += static_cast<char>(c);
        }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if((current_str.length() != num_utf8_bytes))
        {
        for(unsigned int j=0; j<current_str.size()-1; j++)
          {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
          }
        current_str = "";
        }
      }


    if(c == '\n' && !newline_consume)
      {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else if(current_str.empty())
      {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if(s.length() >= minlen && !s.empty() &&
      (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }

      // Reset the string to empty.
      s = "";
      }
    else
      {
      s += current_str;
      }


    if(maxlen > 0 && s.size() == maxlen)
      {
      // Terminate a string if the maximum length is reached.
      if(s.length() >= minlen &&
         (!have_regex || regex.find(s.c_str())))
        {
        output_size += static_cast<int>(s.size()) + 1;
        if(limit_output >= 0 && output_size >= limit_output)
          {
          s = "";
          break;
          }
        strings.push_back(s);
        }
      s = "";
      }
    }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if((!limit_count || strings.size() < limit_count) &&
     !s.empty() && s.length() >= minlen &&
     (!have_regex || regex.find(s.c_str())))
    {
    output_size += static_cast<int>(s.size()) + 1;
    if(limit_output < 0 || output_size < limit_output)
      {
      strings.push_back(s);
      }
    }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for(std::vector<std::string>::const_iterator si = strings.begin();
      si != strings.end(); ++si)
    {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    std::string const& sr = *si;
    for(unsigned int i=0; i < sr.size(); ++i)
      {
      if(sr[i] == ';')
        {
        output += '\\';
        }
      output += sr[i];
      }
    }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}